

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleMakeDirectoryCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  reference __rhs;
  undefined1 local_f8 [8];
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string *cdir;
  undefined1 local_50 [8];
  string expr;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmFileCommand.cxx"
                  ,0x434,
                  "bool cmFileCommand::HandleMakeDirectoryCommand(const std::vector<std::string> &)"
                 );
  }
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(i._M_current);
  expr.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_28,0);
  std::__cxx11::string::string((string *)local_50);
  do {
    cdir = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cdir);
    if (!bVar1) {
      this_local._7_1_ = true;
      error.field_2._12_4_ = 1;
LAB_004c7acf:
      std::__cxx11::string::~string((string *)local_50);
      return this_local._7_1_;
    }
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_28);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
    if (!bVar1) {
      pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)local_50,pcVar3);
      __rhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&e.field_2 + 8),"/",__rhs);
      std::__cxx11::string::operator+=((string *)local_50,(string *)(e.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(e.field_2._M_local_buf + 8));
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmMakefile::CanIWriteThisFile(this_00,pcVar3);
    if (!bVar1) {
      std::operator+(&local_d0,"attempted to create a directory: ",local_60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_d0," into a source directory.");
      std::__cxx11::string::~string((string *)&local_d0);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_b0);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = false;
      error.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_b0);
      goto LAB_004c7acf;
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::MakeDirectory(pcVar3);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "problem creating directory: ",local_60);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_f8);
      this_local._7_1_ = false;
      error.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_f8);
      goto LAB_004c7acf;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleMakeDirectoryCommand(
  std::vector<std::string> const& args)
{
  // File command has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string expr;
  for ( ; i != args.end(); ++i )
    {
    const std::string* cdir = &(*i);
    if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
      {
      expr = this->Makefile->GetCurrentSourceDirectory();
      expr += "/" + *i;
      cdir = &expr;
      }
    if ( !this->Makefile->CanIWriteThisFile(cdir->c_str()) )
      {
      std::string e = "attempted to create a directory: " + *cdir
        + " into a source directory.";
      this->SetError(e);
      cmSystemTools::SetFatalErrorOccured();
      return false;
      }
    if ( !cmSystemTools::MakeDirectory(cdir->c_str()) )
      {
      std::string error = "problem creating directory: " + *cdir;
      this->SetError(error);
      return false;
      }
    }
  return true;
}